

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Message::SetUriPath
          (Error *__return_storage_ptr__,Message *this,string *aUriPath)

{
  ErrorCode EVar1;
  Error *pEVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_78;
  string NormalizedUriPath;
  undefined1 local_40 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&NormalizedUriPath,(string *)aUriPath);
  NormalizeUriPath((Error *)local_40,&NormalizedUriPath);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_40);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_40 + 8));
  if (EVar1 == kNone) {
    OptionValue::OptionValue((OptionValue *)&_Stack_78,&NormalizedUriPath);
    AppendOption((Error *)local_40,this,kUriPath,(OptionValue *)&_Stack_78);
    Error::operator=(__return_storage_ptr__,(Error *)local_40);
    std::__cxx11::string::~string((string *)(local_40 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_78);
  }
  std::__cxx11::string::~string((string *)&NormalizedUriPath);
  return __return_storage_ptr__;
}

Assistant:

Error Message::SetUriPath(const std::string &aUriPath)
{
    Error       error;
    std::string NormalizedUriPath = aUriPath;

    SuccessOrExit(error = NormalizeUriPath(NormalizedUriPath));
    SuccessOrExit(error = AppendOption(OptionType::kUriPath, OptionValue{NormalizedUriPath}));

exit:
    return error;
}